

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetConfidentialTxInIndex
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,uint32_t *index)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *pCVar3;
  allocator local_149;
  OutPoint outpoint;
  Txid local_120;
  string local_100;
  ConfidentialTransactionContext tx;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    tx.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fbb12;
    tx.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x367;
    tx.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_76e377;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&outpoint);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&outpoint,tx_hex_string,(allocator *)&local_120);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,(string *)&outpoint);
    std::__cxx11::string::~string((string *)&outpoint);
    std::__cxx11::string::string((string *)&local_100,txid,&local_149);
    cfd::core::Txid::Txid(&local_120,&local_100);
    cfd::core::OutPoint::OutPoint(&outpoint,&local_120,vout);
    cfd::core::Txid::~Txid(&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    if (index != (uint32_t *)0x0) {
      uVar2 = cfd::ConfidentialTransactionContext::GetTxInIndex(&tx,&outpoint);
      *index = uVar2;
    }
    cfd::core::Txid::~Txid(&outpoint.txid_);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
    return 0;
  }
  tx.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)0x4fbb12;
  tx.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x36d;
  tx.super_ConfidentialTransaction.vin_.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_76e377;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"txid is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Failed to parameter. txid is null or empty.",(allocator *)&outpoint);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxInIndex(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    uint32_t* index) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);
    OutPoint outpoint(Txid(txid), vout);
    if (index != nullptr) {
      *index = tx.GetTxInIndex(outpoint);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}